

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macro.c
# Opt level: O0

int macro_getargtype(char *arg)

{
  int iVar1;
  ushort **ppuVar2;
  t_symbol *ptVar3;
  char *__src;
  int local_28;
  char local_21;
  int i;
  char c;
  t_symbol *sym;
  char *arg_local;
  
  sym = (t_symbol *)arg;
  while (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)*(char *)&sym->next] & 0x2000) != 0) {
    sym = (t_symbol *)((long)&sym->next + 1);
  }
  __src = (char *)((long)&sym->next + 1);
  iVar1 = toupper((int)*(char *)&sym->next);
  if (iVar1 == 0) {
    arg_local._4_4_ = 0;
  }
  else if (iVar1 == 0x22) {
    arg_local._4_4_ = 5;
  }
  else if (iVar1 == 0x23) {
    arg_local._4_4_ = 2;
  }
  else {
    if ((iVar1 == 0x41) || (iVar1 - 0x58U < 2)) {
      if (*__src == '\0') {
        return 1;
      }
    }
    else if (iVar1 == 0x5b) {
      return 4;
    }
    local_21 = *__src;
    for (local_28 = 0; local_28 < 0x40; local_28 = local_28 + 1) {
      local_21 = __src[local_28];
      ppuVar2 = __ctype_b_loc();
      if (((((*ppuVar2)[(int)local_21] & 0x800) != 0) && (local_28 == 0)) ||
         ((ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)local_21] & 8) == 0 &&
          (((local_21 != '_' && (local_21 != '.')) && (local_21 != '@')))))) break;
    }
    if (local_28 == 0) {
      arg_local._4_4_ = 3;
    }
    else if (local_21 == '\0') {
      strncpy(symbol + 1,__src,(long)local_28);
      symbol[0] = (char)local_28;
      symbol[local_28 + 1] = '\0';
      ptVar3 = stlook(0);
      if (ptVar3 == (t_symbol *)0x0) {
        arg_local._4_4_ = 6;
      }
      else if ((ptVar3->type == 1) || (ptVar3->type == 2)) {
        arg_local._4_4_ = 6;
      }
      else if (ptVar3->bank == 0xf0) {
        arg_local._4_4_ = 3;
      }
      else {
        arg_local._4_4_ = 6;
      }
    }
    else {
      arg_local._4_4_ = 3;
    }
  }
  return arg_local._4_4_;
}

Assistant:

int
macro_getargtype(char *arg)
{
	struct t_symbol *sym;
	char c;
	int  i;

	/* skip spaces */
	while (isspace(*arg))
		arg++;

	/* get type */
	switch (toupper(*arg++)) {
	case '\0':
		return (NO_ARG);

	case '"':
		return (ARG_STRING);

	case '#':
		return (ARG_IMM);

	case '[':
		return (ARG_INDIRECT);

	case 'A':
	case 'X':
	case 'Y':
		if (*arg == '\0')
			return (ARG_REG);

	default:
		/* symbol */
		c = arg[0];
		for(i = 0; i < SBOLSZ; i++) {
			c = arg[i];
			if (isdigit(c) && (i == 0))
				break;
			if ((!isalnum(c)) && (c != '_') && (c != '.') && (c != '@'))
				break;
		}

		if (i == 0)
			return (ARG_ABS);
		else {
			if (c != '\0')
				return (ARG_ABS);
			else {
				strncpy(&symbol[1], arg, i);
				symbol[0] = i;
				symbol[i+1] = '\0';

				if ((sym = stlook(0)) == NULL)
					return (ARG_LABEL);
				else {
					if((sym->type == UNDEF) || (sym->type == IFUNDEF))
						return (ARG_LABEL);
					if (sym->bank == RESERVED_BANK)
						return (ARG_ABS);
					else
						return (ARG_LABEL);
				}
			}
		}
	}
}